

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O1

bool __thiscall cmDynamicLoaderCache::FlushCache(cmDynamicLoaderCache *this,char *path)

{
  _Rb_tree_header *p_Var1;
  iterator __position;
  allocator local_39;
  key_type local_38;
  
  std::__cxx11::string::string((string *)&local_38,path,&local_39);
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
                       *)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  p_Var1 = &(this->CacheMap)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    cmsys::DynamicLoader::CloseLibrary(*(LibraryHandle *)(__position._M_node + 2));
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void*>,std::_Select1st<std::pair<std::__cxx11::string_const,void*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void*>,std::_Select1st<std::pair<std::__cxx11::string_const,void*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void*>>>
                        *)this,__position);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool cmDynamicLoaderCache::FlushCache(const char* path)
{
  std::map<std::string, cmsys::DynamicLoader::LibraryHandle>::iterator it
    = this->CacheMap.find(path);
  bool ret = false;
  if ( it != this->CacheMap.end() )
    {
    cmsys::DynamicLoader::CloseLibrary(it->second);
    this->CacheMap.erase(it);
    ret = true;
    }
  return ret;
}